

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *this,int num_digits,
          string_view prefix,format_specs specs,bin_writer<1> f)

{
  ulong uVar1;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::int_writer<wchar_t,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::bin_writer<1>_>
  local_48;
  
  local_48.prefix.size_ = prefix.size_;
  local_48.prefix.data_ = prefix.data_;
  local_48.size_ = (uint)num_digits + local_48.prefix.size_;
  local_48.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_48.padding = 0;
    if (local_48.size_ <= uVar1) {
      local_48.padding = uVar1 - local_48.size_;
      local_48.size_ = uVar1;
    }
  }
  else if (num_digits < specs.precision) {
    local_48.padding = (ulong)(uint)(specs.precision - num_digits);
    local_48.size_ = (uint)specs.precision + local_48.prefix.size_;
    local_48.fill = L'0';
  }
  else {
    local_48.padding = 0;
  }
  if (((undefined1  [40])specs & (undefined1  [40])0xf00) == (undefined1  [40])0x0) {
    specs._9_1_ = specs._9_1_ | 2;
  }
  local_48.f = f;
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<wchar_t,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>>
            (this,&specs,&local_48);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }